

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O3

int fy_tag_token_format_internal(fy_token *fyt,void *out,size_t *outszp)

{
  uint uVar1;
  uint uVar2;
  fy_token *fyt_00;
  fy_input *pfVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  char *s;
  uint uVar7;
  int iVar8;
  long lVar9;
  int _l;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  void *pvVar14;
  char *__s;
  int code_length;
  uint8_t code [4];
  size_t handle_size;
  long local_58;
  int local_4c;
  char *local_48;
  uint8_t local_3c [4];
  ulong local_38;
  ulong uVar13;
  
  if (fyt == (fy_token *)0x0) {
    return 0;
  }
  if (fyt->type != FYTT_TAG) {
    return 0;
  }
  if (out == (void *)0x0) {
    local_58 = 0;
  }
  else {
    if (*outszp == 0) {
      return 0;
    }
    local_58 = *outszp + (long)out;
  }
  fyt_00 = (fyt->field_9).tag.fyt_td;
  if (fyt_00 == (fy_token *)0x0) {
    return -1;
  }
  pcVar6 = fy_tag_directive_token_prefix(fyt_00,&local_38);
  if (pcVar6 == (char *)0x0) {
    return -1;
  }
  pfVar3 = (fyt->handle).fyi;
  lVar9 = 0x48;
  switch((pfVar3->cfg).type) {
  case fyit_file:
    pvVar14 = (pfVar3->field_11).file.addr;
    if (pvVar14 != (void *)0x0) goto LAB_0013b3b8;
    break;
  case fyit_stream:
    break;
  case fyit_memory:
  case fyit_alloc:
    lVar9 = 0x28;
    break;
  default:
    goto switchD_0013b3a4_default;
  }
  pvVar14 = *(void **)((long)&(pfVar3->node).next + lVar9);
  if (pvVar14 != (void *)0x0) {
LAB_0013b3b8:
    sVar4 = (fyt->handle).start_mark.input_pos;
    uVar1 = (fyt->field_9).tag_directive.tag_length;
    uVar2 = (fyt->field_9).tag_directive.uri_length;
    local_48 = (char *)(ulong)(fyt->field_9).tag.suffix_length;
    uVar12 = (uint)local_38;
    if (uVar12 != 0 && out != (void *)0x0) {
      uVar7 = uVar12;
      if (local_58 - (long)out < (long)(int)uVar12) {
        uVar7 = (uint)(local_58 - (long)out);
      }
      memcpy(out,pcVar6,(long)(int)uVar7);
      out = (void *)((long)out + (long)(int)uVar7);
    }
    if (local_48 != (char *)0x0) {
      __s = (char *)((long)pvVar14 + (ulong)uVar2 + (ulong)uVar1 + sVar4);
      pcVar6 = __s + (long)local_48;
      uVar13 = local_38;
      local_48 = pcVar6;
      do {
        s = (char *)memchr(__s,0x25,(long)pcVar6 - (long)__s);
        pcVar10 = s;
        if (s == (char *)0x0) {
          pcVar10 = pcVar6;
        }
        iVar11 = (int)((long)pcVar10 - (long)__s);
        if ((out != (void *)0x0) && (iVar11 != 0)) {
          lVar9 = local_58 - (long)out;
          if ((long)iVar11 <= local_58 - (long)out) {
            lVar9 = (long)pcVar10 - (long)__s;
          }
          memcpy(out,__s,(long)(int)lVar9);
          out = (void *)((long)out + (long)(int)lVar9);
          pcVar6 = local_48;
        }
        iVar11 = (int)uVar13 + iVar11;
        if (s == (char *)0x0) {
          return iVar11;
        }
        local_4c = 4;
        __s = fy_uri_esc(s,(long)pcVar6 - (long)s,local_3c,&local_4c);
        iVar5 = local_4c;
        if (__s == (char *)0x0) {
          return iVar11;
        }
        if (local_4c != 0 && out != (void *)0x0) {
          iVar8 = (int)(local_58 - (long)out);
          if ((long)local_4c <= local_58 - (long)out) {
            iVar8 = local_4c;
          }
          memcpy(out,local_3c,(long)iVar8);
          out = (void *)((long)out + (long)iVar8);
          pcVar6 = local_48;
        }
        uVar12 = iVar11 + iVar5;
        uVar13 = (ulong)uVar12;
      } while (__s < pcVar6);
    }
    return uVar12;
  }
switchD_0013b3a4_default:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                ,0x9a,"const void *fy_input_start(const struct fy_input *)");
}

Assistant:

static int fy_tag_token_format_internal(const struct fy_token *fyt, void *out, size_t *outszp) {
    char *o = NULL, *oe = NULL;
    size_t outsz;
    const char *handle, *suffix;
    size_t handle_size, suffix_size;
    int len, code_length, rlen;
    uint8_t code[4];
    const char *t, *s, *e;

    if (!fyt || fyt->type != FYTT_TAG)
        return 0;

    if (out && *outszp <= 0)
        return 0;

    if (out) {
        outsz = *outszp;
        o = out;
        oe = out + outsz;
    }

    if (!fyt->tag.fyt_td)
        return -1;

    handle = fy_tag_directive_token_prefix(fyt->tag.fyt_td, &handle_size);
    if (!handle)
        return -1;

    suffix = fy_atom_data(&fyt->handle) + fyt->tag.skip + fyt->tag.handle_length;
    suffix_size = fyt->tag.suffix_length;

#define O_CPY(_src, _len) \
    do { \
        int _l = (_len); \
        if (o && _l) { \
            int _cl = _l; \
            if (_cl > (oe - o)) \
                _cl = oe - o; \
            memcpy(o, (_src), _cl); \
            o += _cl; \
        } \
        len += _l; \
    } while(0)

    len = 0;
    O_CPY(handle, handle_size);

    /* escape suffix as a URI */
    s = suffix;
    e = s + suffix_size;
    while (s < e) {
        /* find next escape */
        t = memchr(s, '%', e - s);
        rlen = (t ? t : e) - s;
        O_CPY(s, rlen);

        /* end of string */
        if (!t)
            break;
        s = t;

        code_length = sizeof(code);
        t = fy_uri_esc(s, e - s, code, &code_length);
        if (!t)
            break;

        /* output escaped utf8 */
        O_CPY(code, code_length);
        s = t;
    }

#undef O_CPY
    return len;

}